

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O1

void ccp_length_op(ccp_context *ctx,void *blk,int len,unsigned_long seq)

{
  long lVar1;
  uint uVar2;
  undefined8 local_8;
  
  local_8 = (long)blk << 0x20;
  lVar1 = local_8;
  (ctx->a_cipher).state[0xc] = 0;
  (ctx->a_cipher).state[0xd] = 0;
  (ctx->a_cipher).state[0xe] = 0;
  local_8._6_2_ = (ushort)((ulong)blk >> 0x10);
  local_8._5_1_ = (undefined1)((ulong)blk >> 8);
  uVar2 = (int)blk << 0x18 | (uint)CONCAT12(local_8._5_1_,local_8._6_2_ << 8 | local_8._6_2_ >> 8);
  (ctx->a_cipher).state[0xf] = uVar2;
  (ctx->a_cipher).currentIndex = 0x40;
  (ctx->b_cipher).state[0xe] = 0;
  (ctx->b_cipher).state[0xf] = uVar2;
  (ctx->b_cipher).currentIndex = 0x40;
  (ctx->b_cipher).state[0xc] = 1;
  (ctx->b_cipher).state[0xd] = 0;
  local_8 = lVar1;
  smemclr(&local_8,8);
  return;
}

Assistant:

static void ccp_length_op(struct ccp_context *ctx, void *blk, int len,
                          unsigned long seq)
{
    unsigned char iv[8];
    /*
     * According to RFC 4253 (section 6.4), the packet sequence number wraps
     * at 2^32, so its 32 high-order bits will always be zero.
     */
    PUT_32BIT_LSB_FIRST(iv, 0);
    PUT_32BIT_LSB_FIRST(iv + 4, seq);
    chacha20_iv(&ctx->a_cipher, iv);
    chacha20_iv(&ctx->b_cipher, iv);
    /* Reset content block count to 1, as the first is the key for Poly1305 */
    ++ctx->b_cipher.state[12];
    smemclr(iv, sizeof(iv));
}